

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpFormat.h
# Opt level: O0

string * __thiscall
brynet::net::HttpRequest::getResult_abi_cxx11_(string *__return_storage_ptr__,HttpRequest *this)

{
  bool bVar1;
  int iVar2;
  const_reference pvVar3;
  ulong uVar4;
  reference pvVar5;
  value_type *v;
  const_iterator __end2;
  const_iterator __begin2;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range2;
  allocator<char> local_38;
  allocator<char> local_37;
  allocator<char> local_36;
  allocator<char> local_35 [20];
  allocator<char> local_21;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>
  *local_20;
  HttpRequest *local_18;
  HttpRequest *this_local;
  string *ret;
  
  local_18 = this;
  this_local = (HttpRequest *)__return_storage_ptr__;
  if ((getResult[abi:cxx11]()::HttpMethodString_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&getResult[abi:cxx11]()::HttpMethodString_abi_cxx11_), iVar2 != 0)
     ) {
    local_20 = &getResult[abi:cxx11]()::HttpMethodString_abi_cxx11_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&getResult[abi:cxx11]()::HttpMethodString_abi_cxx11_,"HEAD",&local_21);
    local_20 = (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>
                *)0x11f2d8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(getResult[abi:cxx11]()::HttpMethodString_abi_cxx11_._M_elems + 1),"GET",
               local_35);
    local_20 = (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>
                *)0x11f2f8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(getResult[abi:cxx11]()::HttpMethodString_abi_cxx11_._M_elems + 2),"POST",
               &local_36);
    local_20 = (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>
                *)0x11f318;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(getResult[abi:cxx11]()::HttpMethodString_abi_cxx11_._M_elems + 3),"PUT",
               &local_37);
    local_20 = (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>
                *)0x11f338;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(getResult[abi:cxx11]()::HttpMethodString_abi_cxx11_._M_elems + 4),"DELETE"
               ,&local_38);
    std::allocator<char>::~allocator(&local_38);
    std::allocator<char>::~allocator(&local_37);
    std::allocator<char>::~allocator(&local_36);
    std::allocator<char>::~allocator(local_35);
    std::allocator<char>::~allocator(&local_21);
    __cxa_atexit(std::
                 array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>
                 ::~array,&getResult[abi:cxx11]()::HttpMethodString_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&getResult[abi:cxx11]()::HttpMethodString_abi_cxx11_);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  if ((-1 < (int)this->mMethod) && ((int)this->mMethod < 5)) {
    pvVar3 = std::
             array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>
             ::operator[](&getResult[abi:cxx11]()::HttpMethodString_abi_cxx11_,
                          (long)(int)this->mMethod);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)pvVar3);
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__," ");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)this);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"?");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&this->mQuery);
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__," HTTP/1.1\r\n");
  __end2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin(&this->mHeadField);
  v = (value_type *)
      std::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::end(&this->mHeadField);
  while (bVar1 = std::__detail::operator!=
                           (&__end2.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                            ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                              *)&v), bVar1) {
    pvVar5 = std::__detail::
             _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
             ::operator*(&__end2);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)pvVar5);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,": ");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&pvVar5->second);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\r\n");
    std::__detail::
    _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
    ::operator++(&__end2);
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\r\n");
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&this->mBody);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string      getResult() const
            {
                const static std::array<std::string, static_cast<size_t>(HTTP_METHOD::HTTP_METHOD_MAX)> HttpMethodString =
                        {"HEAD", "GET", "POST", "PUT", "DELETE"};

                std::string ret;
                if (mMethod >= HTTP_METHOD::HTTP_METHOD_HEAD && mMethod < HTTP_METHOD::HTTP_METHOD_MAX)
                {
                    ret += HttpMethodString[static_cast<size_t>(mMethod)];
                }

                ret += " ";
                ret += mUrl;
                if (!mQuery.empty())
                {
                    ret += "?";
                    ret += mQuery;
                }

                ret += " HTTP/1.1\r\n";

                for (auto& v : mHeadField)
                {
                    ret += v.first;
                    ret += ": ";
                    ret += v.second;
                    ret += "\r\n";
                }

                ret += "\r\n";

                if (!mBody.empty())
                {
                    ret += mBody;
                }

                return ret;
            }